

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O3

void __thiscall
sisl::utility::isosurface::march_function
          (isosurface *this,function *f,double *isoValue,double *stepSize,vector *origin,
          vector *extent,bool flip_normal,function *dx,function *dy,function *dz)

{
  ply_mesh *this_00;
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  double *pdVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  undefined8 *puVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  Index size;
  vector *pvVar12;
  char cVar13;
  uint uVar14;
  ulong uVar15;
  int *piVar16;
  ushort uVar17;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  double dVar19;
  double dVar20;
  double dVar21;
  vector x;
  vector gv;
  double v010;
  double v001;
  double v110;
  double v100;
  int local_19c;
  int vertexIndexList [12];
  ulong local_168;
  double v000;
  double v111;
  double v101;
  double *local_140;
  double v011;
  int local_130;
  int local_12c;
  vector *local_128;
  ulong local_120;
  int local_118;
  undefined4 uStack_114;
  vector boundary;
  map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
  vMap;
  void *apvStack_40 [2];
  
  uVar15 = (extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (0 < (long)uVar15) {
    pdVar6 = (extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    if (*pdVar6 <= 0.0 && *pdVar6 != 0.0) {
LAB_0010a34f:
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "Invalid extent for marching cubes!";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    if (uVar15 != 1) {
      if (pdVar6[1] <= 0.0 && pdVar6[1] != 0.0) goto LAB_0010a34f;
      if (2 < uVar15) {
        if (pdVar6[2] <= 0.0 && pdVar6[2] != 0.0) goto LAB_0010a34f;
        local_128 = origin;
        vMap._M_t._M_impl._0_8_ = origin;
        vMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = extent;
        if ((origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows != uVar15) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&boundary,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&vMap);
        uVar15 = (extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
        if (0 < (long)uVar15) {
          dVar21 = *stepSize;
          dVar19 = floor(*(extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data / dVar21);
          if ((uVar15 != 1) && (2 < uVar15)) {
            iVar8 = (int)dVar19;
            vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &vMap._M_t._M_impl.super__Rb_tree_header._M_header;
            vMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 vMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            vMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (0 < iVar8) {
              local_12c = iVar8 * 2;
              pvVar12 = local_128;
              iVar9 = 0;
              local_140 = stepSize;
              do {
                lVar10 = (pvVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows;
                if (lVar10 < 1) goto LAB_0010a237;
                pdVar6 = (pvVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                v000 = 0.0;
                v001 = 0.0;
                v010 = 0.0;
                v100 = 0.0;
                v011 = 0.0;
                v110 = 0.0;
                v101 = 0.0;
                v111 = 0.0;
                if ((lVar10 == 1) ||
                   (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows < 2)) goto LAB_0010a237;
                local_130 = iVar9 + 1;
                dVar19 = (double)(float)pdVar6[1];
                if (dVar19 < boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             .m_storage.m_data[1]) {
                  dVar1 = (double)(float)((double)iVar9 * dVar21 + *pdVar6);
                  uVar18 = SUB84(dVar1,0);
                  uVar14 = iVar9 * local_12c;
                  local_120 = 0;
                  do {
                    if ((pvVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows < 3) goto LAB_0010a237;
                    (*f->_vptr_function[2])
                              (uVar18,dVar19,
                               (pvVar12->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[2],f);
                    v000 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                    if ((pvVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows < 3) goto LAB_0010a237;
                    (*f->_vptr_function[2])
                              (SUB84(*stepSize + dVar1,0),dVar19,
                               (pvVar12->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[2],f);
                    v100 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
                    if ((pvVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows < 3) goto LAB_0010a237;
                    (*f->_vptr_function[2])
                              (SUB84(*stepSize + dVar1,0),*stepSize + dVar19,
                               (pvVar12->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[2],f);
                    v110 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
                    if ((pvVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows < 3) goto LAB_0010a237;
                    (*f->_vptr_function[2])
                              (uVar18,*stepSize + dVar19,
                               (pvVar12->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[2],f);
                    v010 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
                    if (((pvVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows < 3) ||
                       (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows < 3)) goto LAB_0010a237;
                    dVar21 = *isoValue;
                    dVar20 = (local_128->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data[2];
                    local_168 = (ulong)((uint)(v000 < dVar21) << 4 |
                                       (uint)((double)CONCAT44(extraout_XMM0_Db_02,
                                                               extraout_XMM0_Da_02) <= dVar21 &&
                                             dVar21 != (double)CONCAT44(extraout_XMM0_Db_02,
                                                                        extraout_XMM0_Da_02)) << 7 |
                                       (uint)(v100 < dVar21) << 5 | (uint)(v110 < dVar21) << 6);
                    iVar9 = ((uVar14 | 1) + (int)local_120) * local_12c;
                    iVar11 = 0;
                    while( true ) {
                      dVar20 = (double)(float)dVar20;
                      dVar21 = *stepSize;
                      if (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data[2] <= dVar20) break;
                      (*f->_vptr_function[2])(uVar18,dVar19,dVar21 + dVar20,f);
                      v001 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
                      (*f->_vptr_function[2])
                                (SUB84(*stepSize + dVar1,0),dVar19,*stepSize + dVar20,f);
                      v101 = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
                      dVar21 = *stepSize;
                      (*f->_vptr_function[2])
                                (SUB84(dVar21 + dVar1,0),dVar21 + dVar19,dVar21 + dVar20,f);
                      v111 = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
                      (*f->_vptr_function[2])(uVar18,*stepSize + dVar19,*stepSize + dVar20,f);
                      v011 = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
                      dVar21 = *isoValue;
                      local_168 = (ulong)((uint)(v101 < dVar21) << 5 |
                                          (uint)(v001 < dVar21) << 4 | (uint)(local_168 >> 4) |
                                          (uint)(v111 < dVar21) << 6 |
                                         (uint)((double)CONCAT44(extraout_XMM0_Db_06,
                                                                 extraout_XMM0_Da_06) <= dVar21 &&
                                               dVar21 != (double)CONCAT44(extraout_XMM0_Db_06,
                                                                          extraout_XMM0_Da_06)) << 7
                                         );
                      if (this->edges[local_168] != 0) {
                        iVar5 = iVar9 + iVar11;
                        _local_118 = CONCAT44(uStack_114,iVar5 * 3);
                        local_19c = iVar5 * 3 + -1;
                        uVar17 = 1;
                        uVar15 = 0;
                        do {
                          if ((uVar17 & this->edges[local_168]) != 0) {
                            (*(code *)((long)&DAT_001120a0 +
                                      (long)(int)(&DAT_001120a0)[uVar15 & 0xffffffff]))();
                            return;
                          }
                          uVar17 = uVar17 * 2;
                          uVar15 = uVar15 + 1;
                        } while (uVar15 != 0xc);
                        iVar5 = this->triangles[local_168][0];
                        if (iVar5 != -1) {
                          piVar16 = this->triangles[local_168] + 1;
                          do {
                            if (flip_normal) {
                              x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._0_4_ = vertexIndexList[iVar5];
                              x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_ = vertexIndexList[*piVar16];
                              x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._0_4_ = vertexIndexList[piVar16[1]];
                              std::
                              vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                              ::emplace_back<std::tuple<int,int,int>>
                                        ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                                          *)&this->faces,(tuple<int,_int,_int> *)&x);
                            }
                            else {
                              x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._0_4_ = vertexIndexList[piVar16[1]];
                              x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_ = vertexIndexList[*piVar16];
                              x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._0_4_ = vertexIndexList[iVar5];
                              std::
                              vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                              ::emplace_back<std::tuple<int,int,int>>
                                        ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                                          *)&this->faces,(tuple<int,_int,_int> *)&x);
                            }
                            iVar5 = piVar16[2];
                            piVar16 = piVar16 + 3;
                          } while (iVar5 != -1);
                        }
                      }
                      dVar20 = dVar20 + *stepSize;
                      iVar11 = iVar11 + 1;
                      v010 = v011;
                      v110 = v111;
                      v100 = v101;
                      v000 = v001;
                      if (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows < 3) goto LAB_0010a237;
                    }
                    local_120 = (ulong)((int)local_120 + 1);
                    dVar19 = (double)(float)(dVar19 + dVar21);
                    pvVar12 = local_128;
                  } while (dVar19 < boundary.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data[1]);
                }
                iVar9 = local_130;
              } while (local_130 != iVar8);
            }
            processFaces(this,&vMap,&this->faces);
            (*f->_vptr_function[8])(0,apvStack_40,f,0,0);
            free(apvStack_40[0]);
            v010 = (double)((ulong)v010 & 0xffffffff00000000);
            if ((this->plyfile).m_currentIndex != 0) {
              cVar13 = (dx != (function *)0x0 && dy != (function *)0x0) && dz != (function *)0x0;
              this_00 = &this->plyfile;
              local_19c = CONCAT31(local_19c._1_3_,cVar13);
              do {
                ply_mesh::get_vertex_pos((ply_mesh *)&x,(uint *)this_00);
                gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                     (double *)0x0;
                gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
                     0;
                pdVar6 = (double *)malloc(0x18);
                if (((ulong)pdVar6 & 0xf) != 0) {
LAB_0010a260:
                  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                                ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                                "void *Eigen::internal::aligned_malloc(std::size_t)");
                }
                if (pdVar6 == (double *)0x0) {
                  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar7 = std::ios::widen;
                  __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
                     3;
                gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                     pdVar6;
                if (cVar13 == '\0') {
                  (*f->_vptr_function[9])(vertexIndexList,f,&x);
                  uVar3 = vertexIndexList._8_8_;
                  uVar2 = vertexIndexList._0_8_;
                  if (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows != vertexIndexList._8_8_) {
                    if ((long)vertexIndexList._8_8_ < 0) {
                      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                                   );
                    }
                    free(gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                         .m_data);
                    if (uVar3 == 0) {
                      pdVar6 = (double *)0x0;
                    }
                    else {
                      if ((ulong)uVar3 >> 0x3d != 0) {
LAB_0010a374:
                        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
                        *puVar7 = std::ios::widen;
                        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                      }
                      pdVar6 = (double *)malloc(uVar3 * 8);
                      if (uVar3 != 1 && ((ulong)pdVar6 & 0xf) != 0) goto LAB_0010a260;
                      if (pdVar6 == (double *)0x0) goto LAB_0010a374;
                    }
                    uVar4 = vertexIndexList._8_8_;
                    vertexIndexList[2] = (int)uVar3;
                    vertexIndexList[3] = SUB84(uVar3,4);
                    gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows._0_4_ = vertexIndexList[2];
                    gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows._4_4_ = vertexIndexList[3];
                    gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data = pdVar6;
                    vertexIndexList._8_8_ = uVar4;
                  }
                  uVar15 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
                  if (1 < (long)uVar3) {
                    lVar10 = 0;
                    do {
                      pdVar6 = (double *)(uVar2 + lVar10 * 8);
                      dVar21 = pdVar6[1];
                      gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data[lVar10] = *pdVar6;
                      (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + lVar10)[1] = dVar21;
                      lVar10 = lVar10 + 2;
                    } while (lVar10 < (long)uVar15);
                  }
                  if ((long)uVar15 < (long)uVar3) {
                    do {
                      gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data[uVar15] = *(double *)(uVar2 + uVar15 * 8);
                      uVar15 = uVar15 + 1;
                    } while (uVar3 != uVar15);
                  }
                  free((void *)vertexIndexList._0_8_);
                  cVar13 = (char)local_19c;
                }
                else {
                  (*dx->_vptr_function[3])(dx,&x);
                  vertexIndexList._0_8_ = &gv;
                  vertexIndexList[2] = 0;
                  vertexIndexList[3] = 0;
                  vertexIndexList[4] = 1;
                  vertexIndexList[5] = 0;
                  vertexIndexList[6] = 1;
                  vertexIndexList[7] = 0;
                  if (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows < 1) {
                    vertexIndexList._0_8_ = &gv;
                    vertexIndexList[6] = 1;
                    vertexIndexList[7] = 0;
                    vertexIndexList[4] = 1;
                    vertexIndexList[5] = 0;
                    vertexIndexList[2] = 0;
                    vertexIndexList[3] = 0;
                    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                                 );
                  }
                  *gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data = (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
                  (*dy->_vptr_function[3])(dy,&x);
                  v000 = (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
                  this_01 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
                            operator_((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      vertexIndexList,&v000);
                  (*dz->_vptr_function[3])(dz,&x);
                  v001 = (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
                  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                            (this_01,&v001);
                  if ((vertexIndexList._24_8_ + vertexIndexList._8_8_ !=
                       *(long *)(vertexIndexList._0_8_ + 8)) || (vertexIndexList._16_8_ != 1)) {
                    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                                 );
                  }
                }
                if (flip_normal) {
                  v000 = (double)&gv;
                  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                  PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)vertexIndexList,
                             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)&v000);
                  ply_mesh::set_normal(this_00,(uint *)&v010,(vector *)vertexIndexList);
                  free((void *)vertexIndexList._0_8_);
                }
                else {
                  ply_mesh::set_normal(this_00,(uint *)&v010,&gv);
                }
                free(gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data);
                free((void *)CONCAT44(x.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data._4_4_,
                                      (int)x.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data));
                uVar14 = v010._0_4_ + 1;
                v010 = (double)CONCAT44(v010._4_4_,uVar14);
              } while (uVar14 < (uint)this_00->m_currentIndex);
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_sisl::vertex3>,_std::_Select1st<std::pair<const_int,_sisl::vertex3>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
            ::~_Rb_tree(&vMap._M_t);
            free(boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
            return;
          }
        }
      }
    }
  }
LAB_0010a237:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void march_function(
            function *f,
            const double &isoValue,
            const double &stepSize,
            sisl::vector origin,
            sisl::vector extent,
            bool flip_normal = false,
            sisl::function *dx = nullptr,
            sisl::function *dy = nullptr,
            sisl::function *dz = nullptr){

        // Namespaces
        using namespace std;
        using namespace sisl;

        if(extent[0] < 0 || extent[1] < 0 || extent[2] < 0) throw "Invalid extent for marching cubes!";

        sisl::vector boundary = origin + extent;
        // Figure out the steps in each direction
        int xres = (int)floor((extent[0])/stepSize);
        int yres = (int)floor((extent[1])/stepSize);
        int zres = (int)floor((extent[2])/stepSize);
        int res = xres*2;

        map<int, sisl::vertex3 > vMap;

        #pragma omp parallel for
        for(int i = 0; i < xres; i++) {
            float x = origin[0] + i * stepSize;
            int j = 0;

            double     v000 = 0, v001 = 0, v010 = 0, v100 = 0,
                    v011 = 0, v110 = 0, v101 = 0, v111 = 0;
            // Break up the inner loops over
            for(float y = origin[1]; y < boundary[1]; y+=stepSize,j++) {
                int idx = 0;
                int k = 0;

                // Eval these only once
                v000 = (*f)(x,                y,            origin[2]);
                v100 = (*f)(x+stepSize,     y,             origin[2]);
                v110 = (*f)(x+stepSize,     y+stepSize,    origin[2]);
                v010 = (*f)(x,                y+stepSize,    origin[2]);

                idx |=    (v000 < isoValue) ? 16 : 0;     // {0,0,0}, 0001000
                idx |=    (v100 < isoValue) ? 32 : 0;     // {1,0,0}, 0010000
                idx |=    (v110 < isoValue) ? 64 : 0;     // {1,1,0}, 0100000
                idx |=    (v010 < isoValue) ? 128 : 0;     // {0,1,0}, 1000000

                for(float z = origin[2]; z < boundary[2]; z+=stepSize, k++) {
                    v001 = (*f)(x,                y,             z+stepSize);
                    v101 = (*f)(x+stepSize,        y,             z+stepSize);
                    v111 = (*f)(x+stepSize,        y+stepSize,    z+stepSize);
                    v011 = (*f)(x,                y+stepSize,    z+stepSize);

                    idx >>= 4;
                    idx |= (v001 < isoValue) ? 16 : 0 ;  // {0,0,1}
                    idx |= (v101 < isoValue) ? 32 : 0 ;  // {1,0,1}
                    idx |= (v111 < isoValue) ? 64 : 0 ;  // {1,1,1}
                    idx |= (v011 < isoValue) ? 128 : 0 ; // {0,1,1}

                    // Cube is entirely in/out of the surface
                    if (!edges[idx]){
                        v000 = v001;
                        v100 = v101;
                        v110 = v111;
                        v010 = v011;
                        continue;
                    }

                    // Find the vertices where the surface intersects the cube
                    int edgeBit = 1;
                    int vertexIndexList[12];

                    #define MAP_INDEX(x,y,z) (( (((x+i)*res) + (y+j))*res)+(z+k)-1)
                    #define ss stepSize
                    for(int c = 0; c < 12; c++) {
                        if(edges[idx] & edgeBit){
                            switch(c){
                                case 0:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3;//vIndex*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x+ss,y,z,1,1,1),
                                        v000,v100,isoValue,ss,f);
                                    break;

                                case 2:
                                    vertexIndexList[c] = MAP_INDEX(0,1,0) * 3; //(vIndex+zres)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y+ss,z,1,1,1),
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        v010,v110,isoValue,ss,f);
                                    break;
                                case 4:
                                    vertexIndexList[c] = MAP_INDEX(0,0,1) * 3; //(vIndex+1)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        vertex3(x,y,z+ss,1,1,1),
                                        v101,v001,isoValue,ss,f);
                                    break;
                                case 6:
                                    vertexIndexList[c] = MAP_INDEX(0,1,1) * 3; //(vIndex+yres+1)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v111,v011,isoValue,ss,f);
                                    break;
                                /////////////

                                case 1:
                                    vertexIndexList[c] = MAP_INDEX(1,0,0) * 3 + 1;//(vIndex+yres*zres)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z,1,1,1),
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        v100,v110,isoValue,ss,f);
                                    break;

                                case 3:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3 + 1;//vIndex*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x,y+ss,z,1,1,1),
                                        v000,v010,isoValue,ss,f);
                                    break; // 0, 0, 0

                                case 5:
                                    vertexIndexList[c] = MAP_INDEX(1,0,1) * 3 + 1;//(vIndex+yres*zres+1)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        v101,v111,isoValue,ss,f);
                                    break; // 1, 0, 1
                                case 7:
                                    vertexIndexList[c] = MAP_INDEX(0,0,1) * 3 + 1;//(vIndex+1)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z+ss,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v001,v011,isoValue,ss,f);
                                    break; //0,0,1

                                //////////////////////////////

                                case 8:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3 + 2;//vIndex*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x,y,z+ss,1,1,1),
                                        v000,v001,isoValue,ss,f);
                                    break; //0,0,0
                                case 9:
                                    vertexIndexList[c] = MAP_INDEX(1,0,0) * 3 + 2;//(vIndex+yres*zres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z,1,1,1),
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        v100,v101,isoValue,ss,f);
                                    break; //1,0,0
                                case 10:
                                    vertexIndexList[c] = MAP_INDEX(1,1,0) * 3 + 2;//(vIndex+yres*zres+zres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        v110,v111,isoValue,ss,f);
                                    break; //1,1,0
                                case 11:
                                    vertexIndexList[c] = MAP_INDEX(0,1,0) * 3 + 2;//(vIndex+yres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y+ss,z,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v010,v011,isoValue,ss,f);
                                    break; //0,1,0
                            }
                        }
                        edgeBit<<=1;
                    }

                    #undef ss
                    #undef MAP_INDEX

                    // Create the triangles
                    for(int c = 0; triangles[idx][c] != -1;){

                        #pragma omp critical (add_face2)
                        {
                            if(flip_normal) {
                                faces.push_back(tuple<int,int,int>(
                                    vertexIndexList[triangles[idx][c+2]],
                                    vertexIndexList[triangles[idx][c+1]],
                                    vertexIndexList[triangles[idx][c]]));

                            }else {
                                faces.push_back(tuple<int,int,int>(
                                    vertexIndexList[triangles[idx][c]],
                                    vertexIndexList[triangles[idx][c+1]],
                                    vertexIndexList[triangles[idx][c+2]]));
                            }
                            c += 3;
                        }
                    }

                    // Setup for next cube
                    v000 = v001;
                    v100 = v101;
                    v110 = v111;
                    v010 = v011;
                }
            }
        }
        processFaces(&vMap, faces);

        // Now that we know where all the vertices should lie, 
        // let's figure out the normal directions
        bool use_grad = false;
        try {
            f->grad(0,0,0);
            use_grad = true;
        } catch(const char *e) { }
        bool use_d_func = !(dx == nullptr || dy == nullptr || dz == nullptr); 

        for(unsigned int i = 0; i < plyfile.count_vertices(); i++) {
            vector x = plyfile.get_vertex_pos(i);
            vector gv(3);

            if(use_d_func) {
                gv << (*dx)(x), (*dy)(x), (*dz)(x);
            }else if(use_grad) {
                gv = f->grad(x);
            }else {
                double h = m_shadingSs;
                double ddx = ((*f)(x[0]+h, x[1]  , x[2]  ) - (*f)(x[0]-h, x[1]  , x[2]  ))/(2*h);
                double ddy = ((*f)(x[0],   x[1]+h, x[2]  ) - (*f)(x[0]  , x[1]-h, x[2]  ))/(2*h);
                double ddz = ((*f)(x[0],   x[1]  , x[2]+h) - (*f)(x[0]  , x[1]  , x[2]-h))/(2*h);
                gv << ddx, ddy, ddz;
            }
            if(flip_normal)
                plyfile.set_normal(i, -gv);
            else
                plyfile.set_normal(i, gv);
        }

    }